

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  CppType CVar4;
  uint uVar5;
  FieldType type;
  size_t sVar6;
  size_t sVar7;
  Reflection *this;
  ulong uVar8;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if ((field[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    CVar4 = FieldDescriptor::cpp_type(field);
    if ((CVar4 == CPPTYPE_MESSAGE) && (*(int *)(field + 0x3c) != 3)) {
      sVar6 = MessageSetItemByteSize(field,message);
      return sVar6;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar5 = Reflection::FieldSize(this,message,field);
    uVar8 = (ulong)uVar5;
  }
  else if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
    bVar3 = Reflection::HasField(this,message,field);
    uVar8 = (ulong)bVar3;
  }
  else {
    uVar8 = 1;
  }
  sVar6 = FieldDataOnlyByteSize(field,message);
  bVar3 = FieldDescriptor::is_packed(field);
  if (bVar3) {
    if (sVar6 == 0) {
      sVar6 = 0;
    }
    else {
      uVar5 = *(int *)(field + 0x44) * 8 + 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar5 = (uint)sVar6 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = (iVar2 * 9 + 0x49U >> 6) + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
  }
  else {
    iVar1 = *(int *)(field + 0x44);
    type = FieldDescriptor::type(field);
    sVar7 = WireFormatLite::TagSize(iVar1,type);
    sVar6 = sVar7 * uVar8 + sVar6;
  }
  return sVar6;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count = FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}